

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O3

int qc_dir_rename(char *dirname,char *newname)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  if (dirname == (char *)0x0) {
    qc_dir_rename_cold_2();
  }
  else if (newname != (char *)0x0) {
    iVar1 = rename(dirname,newname);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                 ,0x11f,"dir rename(%s to %s) failed",dirname,newname);
      iVar1 = -1;
    }
    return iVar1;
  }
  iVar1 = (int)newname;
  qc_dir_rename_cold_1();
  if (dirname != (char *)0x0) {
    iVar3 = 0;
    iVar1 = mkdir(dirname,0);
    if (iVar1 != 0) {
      _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                 ,0x12d,"dir(%s) make failed",dirname);
      iVar3 = -1;
    }
    return iVar3;
  }
  qc_dir_make_cold_1();
  pcVar2 = getcwd(dirname,(long)iVar1);
  return (int)pcVar2;
}

Assistant:

int qc_dir_rename(const char *dirname, const char *newname)
{
    qc_assert(dirname);
    qc_assert(newname);

    if (0 != rename(dirname, newname))
    {
        qc_perror("dir rename(%s to %s) failed", dirname, newname);
        return -1;
    }

    return 0;
}